

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::documentChange(QTextDocumentPrivate *this,int from,int length)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int diff;
  int end;
  int start;
  int local_1c [3];
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0xd4) < 0) {
    *(int *)(in_RDI + 0xd4) = in_ESI;
    *(int *)(in_RDI + 0xd8) = in_EDX;
    *(int *)(in_RDI + 0xdc) = in_EDX;
  }
  else {
    local_c = in_ESI;
    piVar3 = qMin<int>(&local_c,(int *)(in_RDI + 0xd4));
    iVar1 = *piVar3;
    local_10 = local_c + in_EDX;
    local_1c[2] = *(int *)(in_RDI + 0xd4) + *(int *)(in_RDI + 0xdc);
    piVar3 = qMax<int>(&local_10,local_1c + 2);
    local_1c[1] = 0;
    local_1c[0] = (*piVar3 - iVar1) - *(int *)(in_RDI + 0xdc);
    piVar3 = qMax<int>(local_1c + 1,local_1c);
    iVar2 = *piVar3;
    *(int *)(in_RDI + 0xd4) = iVar1;
    *(int *)(in_RDI + 0xd8) = iVar2 + *(int *)(in_RDI + 0xd8);
    *(int *)(in_RDI + 0xdc) = iVar2 + *(int *)(in_RDI + 0xdc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::documentChange(int from, int length)
{
//     qDebug("QTextDocumentPrivate::documentChange: from=%d,length=%d", from, length);
    if (docChangeFrom < 0) {
        docChangeFrom = from;
        docChangeOldLength = length;
        docChangeLength = length;
        return;
    }
    int start = qMin(from, docChangeFrom);
    int end = qMax(from + length, docChangeFrom + docChangeLength);
    int diff = qMax(0, end - start - docChangeLength);
    docChangeFrom = start;
    docChangeOldLength += diff;
    docChangeLength += diff;
}